

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_between_face_area(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,char *msg)

{
  REF_GEOM ref_geom_00;
  REF_CELL ref_cell_00;
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_INT sense;
  REF_DBL v0;
  REF_DBL u0;
  REF_DBL uv [2];
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL uv_area31;
  REF_DBL uv_area30;
  REF_DBL uv_area21;
  REF_DBL uv_area20;
  REF_DBL uv_area_sign;
  REF_DBL uv_area3;
  REF_DBL uv_area2;
  REF_INT cells [2];
  REF_INT ncell;
  REF_INT node;
  REF_INT id;
  REF_INT type;
  REF_INT nodes3 [27];
  REF_INT local_b4;
  REF_INT nodes2 [27];
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  char *msg_local;
  REF_INT new_node_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  ref_geom_00 = ref_grid->geom;
  ref_cell_00 = ref_grid->cell[3];
  node = 2;
  ref_grid_local._4_4_ = ref_geom_unique_id(ref_geom_00,new_node,2,&ncell);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ = ref_geom_uv_area_sign(ref_grid,ncell,&uv_area20);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ =
           ref_cell_list_with2(ref_cell_00,node0,node1,2,cells,(REF_INT *)&uv_area2);
      if (ref_grid_local._4_4_ == 0) {
        if ((long)cells[0] == 2) {
          ref_grid_local._4_4_ = ref_cell_nodes(ref_cell_00,uv_area2._0_4_,nodes3 + 0x1a);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = ref_cell_nodes(ref_cell_00,uv_area2._4_4_,&id);
            if (ref_grid_local._4_4_ == 0) {
              ref_grid_local._4_4_ = ref_geom_uv_area(ref_geom_00,nodes3 + 0x1a,&uv_area3);
              if (ref_grid_local._4_4_ == 0) {
                uv_area3 = uv_area20 * uv_area3;
                ref_grid_local._4_4_ = ref_geom_uv_area(ref_geom_00,&id,&uv_area_sign);
                if (ref_grid_local._4_4_ == 0) {
                  uv_area_sign = uv_area20 * uv_area_sign;
                  for (cells[1] = 0; cells[1] < ref_cell_00->node_per; cells[1] = cells[1] + 1) {
                    if (node0 == nodes3[(long)cells[1] + 0x1a]) {
                      nodes3[(long)cells[1] + 0x1a] = new_node;
                    }
                  }
                  ref_grid_local._4_4_ = ref_geom_uv_area(ref_geom_00,nodes3 + 0x1a,&uv_area21);
                  if (ref_grid_local._4_4_ == 0) {
                    uv_area21 = uv_area20 * uv_area21;
                    for (cells[1] = 0; cells[1] < ref_cell_00->node_per; cells[1] = cells[1] + 1) {
                      if (new_node == nodes3[(long)cells[1] + 0x1a]) {
                        nodes3[(long)cells[1] + 0x1a] = node0;
                      }
                    }
                    for (cells[1] = 0; cells[1] < ref_cell_00->node_per; cells[1] = cells[1] + 1) {
                      if (node1 == nodes3[(long)cells[1] + 0x1a]) {
                        nodes3[(long)cells[1] + 0x1a] = new_node;
                      }
                    }
                    ref_grid_local._4_4_ = ref_geom_uv_area(ref_geom_00,nodes3 + 0x1a,&uv_area30);
                    if (ref_grid_local._4_4_ == 0) {
                      uv_area30 = uv_area20 * uv_area30;
                      for (cells[1] = 0; cells[1] < ref_cell_00->node_per; cells[1] = cells[1] + 1)
                      {
                        if (new_node == nodes3[(long)cells[1] + 0x1a]) {
                          nodes3[(long)cells[1] + 0x1a] = node1;
                        }
                      }
                      for (cells[1] = 0; cells[1] < ref_cell_00->node_per; cells[1] = cells[1] + 1)
                      {
                        if (node0 == (&id)[cells[1]]) {
                          (&id)[cells[1]] = new_node;
                        }
                      }
                      uv[1]._4_4_ = ref_geom_uv_area(ref_geom_00,&id,&uv_area31);
                      if (uv[1]._4_4_ == 0) {
                        uv_area31 = uv_area20 * uv_area31;
                        for (cells[1] = 0; cells[1] < ref_cell_00->node_per; cells[1] = cells[1] + 1
                            ) {
                          if (new_node == (&id)[cells[1]]) {
                            (&id)[cells[1]] = node0;
                          }
                        }
                        for (cells[1] = 0; cells[1] < ref_cell_00->node_per; cells[1] = cells[1] + 1
                            ) {
                          if (node1 == (&id)[cells[1]]) {
                            (&id)[cells[1]] = new_node;
                          }
                        }
                        uv[1]._0_4_ = ref_geom_uv_area(ref_geom_00,&id,
                                                       (REF_DBL *)&ref_private_macro_code_rss_1);
                        if (uv[1]._0_4_ == 0) {
                          _ref_private_macro_code_rss_1 = uv_area20 * _ref_private_macro_code_rss_1;
                          for (cells[1] = 0; cells[1] < ref_cell_00->node_per;
                              cells[1] = cells[1] + 1) {
                            if (new_node == (&id)[cells[1]]) {
                              (&id)[cells[1]] = node1;
                            }
                          }
                          if ((((uv_area3 <= 1e-20) || (uv_area_sign <= 1e-20)) ||
                              (uv_area21 <= 0.0)) ||
                             (((uv_area30 <= 0.0 || (uv_area31 <= 0.0)) ||
                              (_ref_private_macro_code_rss_1 <= 0.0)))) {
                            v0 = 0.0;
                            _ref_private_macro_code_rss_11 = 0.0;
                            printf("%s orig uv area %e %e new %e %e %e %e\n",uv_area3,uv_area_sign,
                                   uv_area21,uv_area30,uv_area31,_ref_private_macro_code_rss_1,msg);
                            for (cells[1] = 0; cells[1] < ref_cell_00->node_per;
                                cells[1] = cells[1] + 1) {
                              if (node0 == nodes3[(long)cells[1] + 0x1a]) {
                                nodes3[(long)cells[1] + 0x1a] = new_node;
                              }
                            }
                            uVar1 = ref_geom_cell_tuv(ref_geom_00,nodes3[0x1a],nodes3 + 0x1a,node,
                                                      &u0,&ref_private_macro_code_rss_12);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x41a,"ref_geom_between_face_area",(ulong)uVar1,"cell uv0");
                              return uVar1;
                            }
                            printf("20uv %.18e %.18e\n",u0 - v0,
                                   uv[0] - _ref_private_macro_code_rss_11);
                            uVar1 = ref_geom_cell_tuv(ref_geom_00,local_b4,nodes3 + 0x1a,node,&u0,
                                                      &ref_private_macro_code_rss_12);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x41d,"ref_geom_between_face_area",(ulong)uVar1,"cell uv0");
                              return uVar1;
                            }
                            printf("20uv %.18e %.18e\n",u0 - v0,
                                   uv[0] - _ref_private_macro_code_rss_11);
                            uVar1 = ref_geom_cell_tuv(ref_geom_00,nodes2[0],nodes3 + 0x1a,node,&u0,
                                                      &ref_private_macro_code_rss_12);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x420,"ref_geom_between_face_area",(ulong)uVar1,"cell uv0");
                              return uVar1;
                            }
                            printf("20uv %.18e %.18e\n",u0 - v0,
                                   uv[0] - _ref_private_macro_code_rss_11);
                            for (cells[1] = 0; cells[1] < ref_cell_00->node_per;
                                cells[1] = cells[1] + 1) {
                              if (new_node == nodes3[(long)cells[1] + 0x1a]) {
                                nodes3[(long)cells[1] + 0x1a] = node0;
                              }
                            }
                            for (cells[1] = 0; cells[1] < ref_cell_00->node_per;
                                cells[1] = cells[1] + 1) {
                              if (node1 == nodes3[(long)cells[1] + 0x1a]) {
                                nodes3[(long)cells[1] + 0x1a] = new_node;
                              }
                            }
                            uVar1 = ref_geom_cell_tuv(ref_geom_00,nodes3[0x1a],nodes3 + 0x1a,node,
                                                      &u0,&ref_private_macro_code_rss_12);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x427,"ref_geom_between_face_area",(ulong)uVar1,"cell uv0");
                              return uVar1;
                            }
                            printf("21uv %.18e %.18e\n",u0 - v0,
                                   uv[0] - _ref_private_macro_code_rss_11);
                            uVar1 = ref_geom_cell_tuv(ref_geom_00,local_b4,nodes3 + 0x1a,node,&u0,
                                                      &ref_private_macro_code_rss_12);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x42a,"ref_geom_between_face_area",(ulong)uVar1,"cell uv0");
                              return uVar1;
                            }
                            printf("21uv %.18e %.18e\n",u0 - v0,
                                   uv[0] - _ref_private_macro_code_rss_11);
                            uVar1 = ref_geom_cell_tuv(ref_geom_00,nodes2[0],nodes3 + 0x1a,node,&u0,
                                                      &ref_private_macro_code_rss_12);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x42d,"ref_geom_between_face_area",(ulong)uVar1,"cell uv0");
                              return uVar1;
                            }
                            printf("21uv %.18e %.18e\n",u0 - v0,
                                   uv[0] - _ref_private_macro_code_rss_11);
                            for (cells[1] = 0; cells[1] < ref_cell_00->node_per;
                                cells[1] = cells[1] + 1) {
                              if (new_node == nodes3[(long)cells[1] + 0x1a]) {
                                nodes3[(long)cells[1] + 0x1a] = node1;
                              }
                            }
                            for (cells[1] = 0; cells[1] < ref_cell_00->node_per;
                                cells[1] = cells[1] + 1) {
                              if (node0 == (&id)[cells[1]]) {
                                (&id)[cells[1]] = new_node;
                              }
                            }
                            uVar1 = ref_geom_cell_tuv(ref_geom_00,id,&id,node,&u0,
                                                      &ref_private_macro_code_rss_12);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x435,"ref_geom_between_face_area",(ulong)uVar1,"cell uv0");
                              return uVar1;
                            }
                            printf("30uv %.18e %.18e\n",u0 - v0,
                                   uv[0] - _ref_private_macro_code_rss_11);
                            uVar1 = ref_geom_cell_tuv(ref_geom_00,type,&id,node,&u0,
                                                      &ref_private_macro_code_rss_12);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x438,"ref_geom_between_face_area",(ulong)uVar1,"cell uv0");
                              return uVar1;
                            }
                            printf("30uv %.18e %.18e\n",u0 - v0,
                                   uv[0] - _ref_private_macro_code_rss_11);
                            uVar1 = ref_geom_cell_tuv(ref_geom_00,nodes3[0],&id,node,&u0,
                                                      &ref_private_macro_code_rss_12);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x43b,"ref_geom_between_face_area",(ulong)uVar1,"cell uv0");
                              return uVar1;
                            }
                            printf("30uv %.18e %.18e\n",u0 - v0,
                                   uv[0] - _ref_private_macro_code_rss_11);
                            for (cells[1] = 0; cells[1] < ref_cell_00->node_per;
                                cells[1] = cells[1] + 1) {
                              if (new_node == (&id)[cells[1]]) {
                                (&id)[cells[1]] = node0;
                              }
                            }
                            for (cells[1] = 0; cells[1] < ref_cell_00->node_per;
                                cells[1] = cells[1] + 1) {
                              if (node1 == (&id)[cells[1]]) {
                                (&id)[cells[1]] = new_node;
                              }
                            }
                            uVar1 = ref_geom_cell_tuv(ref_geom_00,id,&id,node,&u0,
                                                      &ref_private_macro_code_rss_12);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x442,"ref_geom_between_face_area",(ulong)uVar1,"cell uv0");
                              return uVar1;
                            }
                            printf("31uv %.18e %.18e\n",u0 - v0,
                                   uv[0] - _ref_private_macro_code_rss_11);
                            uVar1 = ref_geom_cell_tuv(ref_geom_00,type,&id,node,&u0,
                                                      &ref_private_macro_code_rss_12);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x445,"ref_geom_between_face_area",(ulong)uVar1,"cell uv0");
                              return uVar1;
                            }
                            printf("31uv %.18e %.18e\n",u0 - v0,
                                   uv[0] - _ref_private_macro_code_rss_11);
                            uVar1 = ref_geom_cell_tuv(ref_geom_00,nodes3[0],&id,node,&u0,
                                                      &ref_private_macro_code_rss_12);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0x448,"ref_geom_between_face_area",(ulong)uVar1,"cell uv0");
                              return uVar1;
                            }
                            printf("31uv %.18e %.18e\n",u0 - v0,
                                   uv[0] - _ref_private_macro_code_rss_11);
                            for (cells[1] = 0; cells[1] < ref_cell_00->node_per;
                                cells[1] = cells[1] + 1) {
                              if (new_node == (&id)[cells[1]]) {
                                (&id)[cells[1]] = node1;
                              }
                            }
                          }
                          ref_grid_local._4_4_ = 0;
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                 ,0x40b,"ref_geom_between_face_area",(ulong)uv[1]._0_4_,
                                 "uv area 3 node 1");
                          ref_grid_local._4_4_ = uv[1]._0_4_;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0x405,"ref_geom_between_face_area",(ulong)uv[1]._4_4_,
                               "uv area 3 node 0");
                        ref_grid_local._4_4_ = uv[1]._4_4_;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0x3fe,"ref_geom_between_face_area",(ulong)ref_grid_local._4_4_,
                             "uv area 2 node 1");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0x3f8,"ref_geom_between_face_area",(ulong)ref_grid_local._4_4_,
                           "uv area 2 node 0");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0x3f3,"ref_geom_between_face_area",(ulong)ref_grid_local._4_4_,"uv area 3"
                        );
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x3f1,"ref_geom_between_face_area",(ulong)ref_grid_local._4_4_,"uv area 2");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x3ef,"ref_geom_between_face_area",(ulong)ref_grid_local._4_4_,"cell nodes");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x3ee,"ref_geom_between_face_area",(ulong)ref_grid_local._4_4_,"cell nodes");
          }
        }
        else {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x3ed,"ref_geom_between_face_area","expected two tri for box2 nodes",2,
                 (long)cells[0]);
          ref_grid_local._4_4_ = 1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x3ec,"ref_geom_between_face_area",(ulong)ref_grid_local._4_4_,"list");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x3ea,
             "ref_geom_between_face_area",(ulong)ref_grid_local._4_4_,"uv area sign");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",1000,
           "ref_geom_between_face_area",(ulong)ref_grid_local._4_4_,"unique face id");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_between_face_area(REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1, REF_INT new_node,
                                              const char *msg) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT nodes2[REF_CELL_MAX_SIZE_PER];
  REF_INT nodes3[REF_CELL_MAX_SIZE_PER];
  REF_INT type, id, node;
  REF_INT ncell, cells[2];
  REF_DBL uv_area2, uv_area3, uv_area_sign;
  REF_DBL uv_area20, uv_area21;
  REF_DBL uv_area30, uv_area31;

  type = REF_GEOM_FACE;
  RSS(ref_geom_unique_id(ref_geom, new_node, type, &id), "unique face id");

  RSS(ref_geom_uv_area_sign(ref_grid, id, &uv_area_sign), "uv area sign");

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  REIS(2, ncell, "expected two tri for box2 nodes");
  RSS(ref_cell_nodes(ref_cell, cells[0], nodes2), "cell nodes");
  RSS(ref_cell_nodes(ref_cell, cells[1], nodes3), "cell nodes");

  RSS(ref_geom_uv_area(ref_geom, nodes2, &uv_area2), "uv area 2");
  uv_area2 *= uv_area_sign;
  RSS(ref_geom_uv_area(ref_geom, nodes3, &uv_area3), "uv area 3");
  uv_area3 *= uv_area_sign;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (node0 == nodes2[node]) nodes2[node] = new_node;
  RSS(ref_geom_uv_area(ref_geom, nodes2, &uv_area20), "uv area 2 node 0");
  uv_area20 *= uv_area_sign;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (new_node == nodes2[node]) nodes2[node] = node0;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (node1 == nodes2[node]) nodes2[node] = new_node;
  RSS(ref_geom_uv_area(ref_geom, nodes2, &uv_area21), "uv area 2 node 1");
  uv_area21 *= uv_area_sign;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (new_node == nodes2[node]) nodes2[node] = node1;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (node0 == nodes3[node]) nodes3[node] = new_node;
  RSS(ref_geom_uv_area(ref_geom, nodes3, &uv_area30), "uv area 3 node 0");
  uv_area30 *= uv_area_sign;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (new_node == nodes3[node]) nodes3[node] = node0;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (node1 == nodes3[node]) nodes3[node] = new_node;
  RSS(ref_geom_uv_area(ref_geom, nodes3, &uv_area31), "uv area 3 node 1");
  uv_area31 *= uv_area_sign;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (new_node == nodes3[node]) nodes3[node] = node1;

  if (uv_area2 <= 1e-20 || uv_area3 <= 1e-20 || uv_area20 <= 0 ||
      uv_area21 <= 0 || uv_area30 <= 0 || uv_area31 <= 0) {
    REF_DBL uv[2];
    REF_DBL u0 = 0.0, v0 = 0.0;
    REF_INT sense;
    printf("%s orig uv area %e %e new %e %e %e %e\n", msg, uv_area2, uv_area3,
           uv_area20, uv_area21, uv_area30, uv_area31);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes2[node]) nodes2[node] = new_node;
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[0], nodes2, type, uv, &sense),
        "cell uv0");
    printf("20uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[1], nodes2, type, uv, &sense),
        "cell uv0");
    printf("20uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[2], nodes2, type, uv, &sense),
        "cell uv0");
    printf("20uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes2[node]) nodes2[node] = node0;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes2[node]) nodes2[node] = new_node;
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[0], nodes2, type, uv, &sense),
        "cell uv0");
    printf("21uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[1], nodes2, type, uv, &sense),
        "cell uv0");
    printf("21uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[2], nodes2, type, uv, &sense),
        "cell uv0");
    printf("21uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes2[node]) nodes2[node] = node1;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes3[node]) nodes3[node] = new_node;
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[0], nodes3, type, uv, &sense),
        "cell uv0");
    printf("30uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[1], nodes3, type, uv, &sense),
        "cell uv0");
    printf("30uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[2], nodes3, type, uv, &sense),
        "cell uv0");
    printf("30uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes3[node]) nodes3[node] = node0;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes3[node]) nodes3[node] = new_node;
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[0], nodes3, type, uv, &sense),
        "cell uv0");
    printf("31uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[1], nodes3, type, uv, &sense),
        "cell uv0");
    printf("31uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[2], nodes3, type, uv, &sense),
        "cell uv0");
    printf("31uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes3[node]) nodes3[node] = node1;
  }

  return REF_SUCCESS;
}